

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugstream.cpp
# Opt level: O0

void __thiscall MetaSim::DebugStream::setStream(DebugStream *this,char *filename)

{
  void *pvVar1;
  undefined8 in_RSI;
  long *in_RDI;
  
  if (((*(byte *)(in_RDI + 1) & 1) != 0) && ((long *)*in_RDI != (long *)0x0)) {
    (**(code **)(*(long *)*in_RDI + 8))();
  }
  *(undefined1 *)(in_RDI + 1) = 1;
  pvVar1 = operator_new(0x200);
  std::ofstream::ofstream(pvVar1,in_RSI,0x10);
  *in_RDI = (long)pvVar1;
  return;
}

Assistant:

void DebugStream::setStream(const char *filename)
    {
        if (_autodelete) delete _os;
        _autodelete = true;
        _os = new ofstream(filename); 
    }